

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O1

void qt_scale_image_argb32_on_argb32_sse2
               (uchar *destPixels,int dbpl,uchar *srcPixels,int sbpl,int srch,QRectF *targetRect,
               QRectF *sourceRect,QRect *clip,int const_alpha)

{
  int iVar1;
  uchar *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  Representation RVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  int iVar20;
  undefined4 uVar21;
  uchar *puVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uchar *puVar27;
  Representation RVar28;
  int iVar29;
  long in_FS_OFFSET;
  double dVar30;
  int iVar31;
  int iVar33;
  undefined1 auVar32 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar39;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ushort uVar50;
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ushort uVar53;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  undefined1 auVar54 [16];
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (const_alpha == 0x100) {
    auVar32._0_8_ = sourceRect->w;
    auVar32._8_8_ = sourceRect->h;
    auVar8._0_8_ = targetRect->w;
    auVar8._8_8_ = targetRect->h;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
    iVar20 = srch;
    QRectF::normalized();
    dVar34 = (double)((ulong)local_68 & 0x8000000000000000 | 0x3fe0000000000000) + local_68;
    dVar30 = 2147483647.0;
    if (dVar34 <= 2147483647.0) {
      dVar30 = dVar34;
    }
    if (dVar30 <= -2147483648.0) {
      dVar30 = -2147483648.0;
    }
    local_48._0_4_ = (int)dVar30;
    dVar36 = (double)((ulong)local_60 & 0x8000000000000000 | 0x3fe0000000000000) + local_60;
    dVar34 = 2147483647.0;
    if (dVar36 <= 2147483647.0) {
      dVar34 = dVar36;
    }
    if (dVar34 <= -2147483648.0) {
      dVar34 = -2147483648.0;
    }
    dVar36 = (local_68 - (double)(int)dVar30) * 0.5 + local_58;
    dVar36 = (double)((ulong)dVar36 & 0x8000000000000000 | 0x3fe0000000000000) + dVar36;
    dVar30 = 2147483647.0;
    if (dVar36 <= 2147483647.0) {
      dVar30 = dVar36;
    }
    if (dVar30 <= -2147483648.0) {
      dVar30 = -2147483648.0;
    }
    dVar35 = (local_60 - (double)(int)dVar34) * 0.5 + local_50;
    dVar35 = (double)((ulong)dVar35 & 0x8000000000000000 | 0x3fe0000000000000) + dVar35;
    dVar36 = 2147483647.0;
    if (dVar35 <= 2147483647.0) {
      dVar36 = dVar35;
    }
    if (dVar36 <= -2147483648.0) {
      dVar36 = -2147483648.0;
    }
    local_48._8_4_ = (int)dVar30 + local_48._0_4_ + -1;
    local_48._4_4_ = (int)dVar34;
    RStack_3c.m_i = (int)dVar36 + (int)dVar34 + -1;
    _local_48 = (QRect)QRect::operator&((QRect *)local_48,clip);
    RVar14 = local_48._0_4_;
    RVar28 = local_48._8_4_;
    uVar9 = local_48._4_4_;
    iVar26 = RStack_3c.m_i - local_48._4_4_;
    if ((int)local_48._4_4_ <= RStack_3c.m_i && RVar14.m_i <= RVar28.m_i) {
      auVar32 = divpd(auVar32,auVar8);
      dVar30 = auVar32._0_8_;
      dVar34 = auVar32._8_8_;
      if (0.0 <= dVar30) {
        dVar35 = ceil((((double)RVar14.m_i + 0.5) - targetRect->xp) * dVar30 * 65536.0);
        dVar36 = sourceRect->xp;
        iVar11 = -1;
      }
      else {
        dVar35 = floor((((double)RVar14.m_i + 0.5) - (targetRect->xp + targetRect->w)) * dVar30 *
                       65536.0);
        dVar36 = sourceRect->xp + sourceRect->w;
        iVar11 = 1;
      }
      iVar31 = (int)(dVar30 * 65536.0);
      iVar33 = (int)(dVar34 * 65536.0);
      iVar7 = (int)(long)(dVar36 * 65536.0);
      uVar24 = iVar11 + iVar7 + (int)dVar35;
      dVar30 = (double)(int)uVar9 + 0.5;
      if (0.0 <= dVar34) {
        dVar34 = ceil((dVar30 - targetRect->yp) * dVar34 * 65536.0);
        dVar30 = sourceRect->yp;
        iVar10 = -1;
      }
      else {
        dVar34 = floor((dVar30 - (targetRect->yp + targetRect->h)) * dVar34 * 65536.0);
        dVar30 = sourceRect->yp + sourceRect->h;
        iVar10 = 1;
      }
      auVar8 = _DAT_006ce790;
      auVar32 = _DAT_006ce780;
      uVar16 = (int)(long)(dVar30 * 65536.0) + iVar10 + (int)dVar34;
      auVar42._4_4_ = iVar31;
      auVar42._0_4_ = iVar31;
      auVar42._8_4_ = iVar33;
      auVar42._12_4_ = iVar33;
      uVar21 = movmskpd(iVar20,auVar42);
      bVar18 = ((byte)uVar21 & 2) >> 1 & srch <= (int)(uVar16 >> 0x10);
      iVar20 = 0;
      if (bVar18 != 0) {
        iVar20 = iVar33;
      }
      uVar16 = iVar20 + uVar16;
      iVar26 = iVar26 - (uint)bVar18;
      bVar18 = sbpl >> 2 <= (int)(uVar24 >> 0x10) & (byte)uVar21;
      iVar20 = 0;
      if (bVar18 != 0) {
        iVar20 = iVar31;
      }
      iVar25 = uVar24 + iVar20;
      iVar29 = (RVar28.m_i - RVar14.m_i) - (uint)bVar18;
      iVar10 = iVar26 + 1;
      if (srch <= (int)(iVar26 * iVar33 + uVar16 >> 0x10)) {
        iVar10 = iVar26;
      }
      iVar26 = iVar29 + 1;
      if (sbpl >> 2 <= (int)((uint)(iVar29 * iVar31 + iVar25) >> 0x10)) {
        iVar26 = iVar29;
      }
      if (0 < iVar10) {
        puVar22 = destPixels + (long)RVar14.m_i * 4 + (long)(uVar9 * dbpl);
        uVar23 = (ulong)iVar26;
        puVar27 = puVar22;
        do {
          uVar19 = (ulong)((byte)-((byte)(((ulong)puVar27 & 0xffffffff) >> 2) & 0x3f) & 3);
          if (uVar23 < uVar19) {
            uVar19 = uVar23;
          }
          uVar24 = (uVar16 >> 0x10) * sbpl;
          uVar17 = (ulong)(-((uint)((ulong)puVar22 >> 2) & 0x3fffffff) & 3);
          if (uVar23 <= uVar17) {
            uVar17 = uVar23;
          }
          uVar13 = 0;
          iVar29 = iVar25;
          if (uVar17 != 0) {
            uVar13 = 0;
            do {
              uVar17 = (ulong)(~*(uint *)(srcPixels + (long)(iVar29 >> 0x10) * 4 + (ulong)uVar24) >>
                              0x18) *
                       (((ulong)*(uint *)(puVar22 + uVar13 * 4) << 0x18 |
                        (ulong)*(uint *)(puVar22 + uVar13 * 4)) & 0xff00ff00ff00ff);
              uVar17 = uVar17 + 0x80008000800080 + (uVar17 >> 8 & 0xff00ff00ff00ff) >> 8 &
                       0xff00ff00ff00ff;
              *(uint *)(puVar22 + uVar13 * 4) =
                   ((uint)(uVar17 >> 0x18) | (uint)uVar17) +
                   *(uint *)(srcPixels + (long)(iVar29 >> 0x10) * 4 + (ulong)uVar24);
              iVar29 = iVar29 + iVar31;
              uVar13 = uVar13 + 1;
            } while (uVar19 != uVar13);
          }
          if ((int)uVar13 < iVar26 + -3) {
            iVar1 = iVar29 + iVar31 + iVar31;
            auVar37._4_4_ = iVar1;
            auVar37._0_4_ = iVar1 + iVar31;
            auVar37._12_4_ = iVar29;
            auVar37._8_4_ = iVar29 + iVar31;
            uVar13 = uVar13 & 0xffffffff;
            do {
              uVar12 = *(uint *)(srcPixels + (ulong)auVar37._2_2_ * 4 + (ulong)uVar24);
              uVar15 = *(uint *)(srcPixels + (ulong)auVar37._6_2_ * 4 + (ulong)uVar24);
              uVar4 = *(uint *)(srcPixels + (ulong)auVar37._10_2_ * 4 + (ulong)uVar24);
              uVar5 = *(uint *)(srcPixels + (ulong)auVar37._14_2_ * 4 + (ulong)uVar24);
              auVar52._0_4_ = -(uint)(0x7effffff < (int)(uVar5 ^ 0x80000000));
              auVar52._4_4_ = -(uint)(0x7effffff < (int)(uVar4 ^ 0x80000000));
              auVar52._8_4_ = -(uint)(0x7effffff < (int)(uVar15 ^ 0x80000000));
              auVar52._12_4_ = -(uint)(0x7effffff < (int)(uVar12 ^ 0x80000000));
              iVar29 = movmskps((uint)auVar37._2_2_,auVar52);
              if (iVar29 == 0xf) {
                puVar3 = (uint *)(puVar22 + uVar13 * 4);
                *puVar3 = uVar5;
                puVar3[1] = uVar4;
                puVar3[2] = uVar15;
                puVar3[3] = uVar12;
              }
              else {
                auVar40._0_4_ = -(uint)(-0x7f000001 < (int)(uVar5 ^ 0x80000000));
                auVar40._4_4_ = -(uint)(-0x7f000001 < (int)(uVar4 ^ 0x80000000));
                auVar40._8_4_ = -(uint)(-0x7f000001 < (int)(uVar15 ^ 0x80000000));
                auVar40._12_4_ = -(uint)(-0x7f000001 < (int)(uVar12 ^ 0x80000000));
                iVar29 = movmskps(iVar29,auVar40);
                if (iVar29 != 0) {
                  auVar41._0_4_ = uVar5 >> 0x18;
                  auVar41._4_4_ = uVar4 >> 0x18;
                  auVar41._8_4_ = uVar15 >> 0x18;
                  auVar41._12_4_ = uVar12 >> 0x18;
                  auVar51._0_4_ = auVar41._0_4_ << 0x10;
                  auVar51._4_4_ = auVar41._4_4_ << 0x10;
                  auVar51._8_4_ = auVar41._8_4_ << 0x10;
                  auVar51._12_4_ = auVar41._12_4_ << 0x10;
                  auVar52 = (auVar51 | auVar41) ^ auVar32;
                  auVar42 = *(undefined1 (*) [16])(puVar22 + uVar13 * 4);
                  uVar53 = (auVar42._0_2_ >> 8) * auVar52._0_2_;
                  uVar55 = (auVar42._2_2_ >> 8) * auVar52._2_2_;
                  uVar56 = (auVar42._4_2_ >> 8) * auVar52._4_2_;
                  uVar57 = (auVar42._6_2_ >> 8) * auVar52._6_2_;
                  uVar58 = (auVar42._8_2_ >> 8) * auVar52._8_2_;
                  uVar59 = (auVar42._10_2_ >> 8) * auVar52._10_2_;
                  uVar60 = (auVar42._12_2_ >> 8) * auVar52._12_2_;
                  uVar61 = (auVar42._14_2_ >> 8) * auVar52._14_2_;
                  auVar42 = auVar42 & auVar32;
                  uVar39 = auVar42._0_2_ * auVar52._0_2_;
                  uVar44 = auVar42._2_2_ * auVar52._2_2_;
                  uVar45 = auVar42._4_2_ * auVar52._4_2_;
                  uVar46 = auVar42._6_2_ * auVar52._6_2_;
                  uVar47 = auVar42._8_2_ * auVar52._8_2_;
                  uVar48 = auVar42._10_2_ * auVar52._10_2_;
                  uVar49 = auVar42._12_2_ * auVar52._12_2_;
                  uVar50 = auVar42._14_2_ * auVar52._14_2_;
                  auVar54._0_2_ = uVar53 + 0x80 + (uVar53 >> 8);
                  auVar54._2_2_ = uVar55 + 0x80 + (uVar55 >> 8);
                  auVar54._4_2_ = uVar56 + 0x80 + (uVar56 >> 8);
                  auVar54._6_2_ = uVar57 + 0x80 + (uVar57 >> 8);
                  auVar54._8_2_ = uVar58 + 0x80 + (uVar58 >> 8);
                  auVar54._10_2_ = uVar59 + 0x80 + (uVar59 >> 8);
                  auVar54._12_2_ = uVar60 + 0x80 + (uVar60 >> 8);
                  auVar54._14_2_ = uVar61 + 0x80 + (uVar61 >> 8);
                  auVar43._0_2_ = (ushort)(uVar39 + 0x80 + (uVar39 >> 8)) >> 8;
                  auVar43._2_2_ = (ushort)(uVar44 + 0x80 + (uVar44 >> 8)) >> 8;
                  auVar43._4_2_ = (ushort)(uVar45 + 0x80 + (uVar45 >> 8)) >> 8;
                  auVar43._6_2_ = (ushort)(uVar46 + 0x80 + (uVar46 >> 8)) >> 8;
                  auVar43._8_2_ = (ushort)(uVar47 + 0x80 + (uVar47 >> 8)) >> 8;
                  auVar43._10_2_ = (ushort)(uVar48 + 0x80 + (uVar48 >> 8)) >> 8;
                  auVar43._12_2_ = (ushort)(uVar49 + 0x80 + (uVar49 >> 8)) >> 8;
                  auVar43._14_2_ = (ushort)(uVar50 + 0x80 + (uVar50 >> 8)) >> 8;
                  auVar43 = auVar43 | auVar54 & auVar8;
                  puVar2 = puVar22 + uVar13 * 4;
                  *puVar2 = auVar43[0] + (char)uVar5;
                  puVar2[1] = auVar43[1] + (char)(uVar5 >> 8);
                  puVar2[2] = auVar43[2] + (char)(uVar5 >> 0x10);
                  puVar2[3] = auVar43[3] + (char)(uVar5 >> 0x18);
                  puVar2[4] = auVar43[4] + (char)uVar4;
                  puVar2[5] = auVar43[5] + (char)(uVar4 >> 8);
                  puVar2[6] = auVar43[6] + (char)(uVar4 >> 0x10);
                  puVar2[7] = auVar43[7] + (char)(uVar4 >> 0x18);
                  puVar2[8] = auVar43[8] + (char)uVar15;
                  puVar2[9] = auVar43[9] + (char)(uVar15 >> 8);
                  puVar2[10] = auVar43[10] + (char)(uVar15 >> 0x10);
                  puVar2[0xb] = auVar43[0xb] + (char)(uVar15 >> 0x18);
                  puVar2[0xc] = auVar43[0xc] + (char)uVar12;
                  puVar2[0xd] = auVar43[0xd] + (char)(uVar12 >> 8);
                  puVar2[0xe] = auVar43[0xe] + (char)(uVar12 >> 0x10);
                  puVar2[0xf] = auVar43[0xf] + (char)(uVar12 >> 0x18);
                }
              }
              auVar38._0_4_ = auVar37._0_4_ + iVar31 * 4;
              auVar38._4_4_ = auVar37._4_4_ + iVar31 * 4;
              auVar38._8_4_ = auVar37._8_4_ + iVar31 * 4;
              auVar38._12_4_ = auVar37._12_4_ + iVar31 * 4;
              uVar13 = uVar13 + 4;
              auVar37 = auVar38;
            } while ((long)uVar13 < (long)(iVar26 + -3));
          }
          if ((int)uVar13 < iVar26) {
            uVar19 = uVar13 & 0xffffffff;
            uVar12 = (int)uVar13 * iVar31 + (int)dVar35 + iVar7 + iVar20 + iVar11;
            uVar15 = 0;
            do {
              uVar19 = uVar19 + 1;
              uVar17 = (ulong)(~*(uint *)(srcPixels + (ulong)(uVar12 >> 0x10) * 4 + (ulong)uVar24)
                              >> 0x18) *
                       (((ulong)*(uint *)(puVar22 + uVar19 * 4 + -4) << 0x18 |
                        (ulong)*(uint *)(puVar22 + uVar19 * 4 + -4)) & 0xff00ff00ff00ff);
              uVar17 = uVar17 + 0x80008000800080 + (uVar17 >> 8 & 0xff00ff00ff00ff) >> 8 &
                       0xff00ff00ff00ff;
              *(uint *)(puVar22 + uVar19 * 4 + -4) =
                   ((uint)(uVar17 >> 0x18) | (uint)uVar17) +
                   *(uint *)(srcPixels + (ulong)(uVar12 >> 0x10) * 4 + (ulong)uVar24);
              if (1 < uVar15) break;
              uVar15 = uVar15 + 1;
              uVar12 = uVar12 + iVar31;
            } while ((long)uVar19 < (long)uVar23);
          }
          puVar22 = puVar22 + dbpl;
          uVar16 = uVar16 + iVar33;
          puVar27 = puVar27 + dbpl;
          bVar6 = 1 < iVar10;
          iVar10 = iVar10 + -1;
        } while (bVar6);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qt_scale_image_argb32_on_argb32
              (destPixels,dbpl,srcPixels,sbpl,srch,targetRect,sourceRect,clip,const_alpha);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_scale_image_argb32_on_argb32_sse2(uchar *destPixels, int dbpl,
                                          const uchar *srcPixels, int sbpl, int srch,
                                          const QRectF &targetRect,
                                          const QRectF &sourceRect,
                                          const QRect &clip,
                                          int const_alpha)
{
    if (const_alpha != 256) {
        // from qblendfunctions.cpp
        extern void qt_scale_image_argb32_on_argb32(uchar *destPixels, int dbpl,
                                               const uchar *srcPixels, int sbpl, int srch,
                                               const QRectF &targetRect,
                                               const QRectF &sourceRect,
                                               const QRect &clip,
                                               int const_alpha);
        return qt_scale_image_argb32_on_argb32(destPixels, dbpl, srcPixels, sbpl, srch, targetRect, sourceRect, clip, const_alpha);
    }

    qreal sx = sourceRect.width() / (qreal)targetRect.width();
    qreal sy = sourceRect.height() / (qreal)targetRect.height();

    const int ix = 0x00010000 * sx;
    const int iy = 0x00010000 * sy;

    QRect tr = targetRect.normalized().toRect();
    tr = tr.intersected(clip);
    if (tr.isEmpty())
        return;
    const int tx1 = tr.left();
    const int ty1 = tr.top();
    int h = tr.height();
    int w = tr.width();

    quint32 basex;
    quint32 srcy;

    if (sx < 0) {
        int dstx = qFloor((tx1 + qreal(0.5) - targetRect.right()) * sx * 65536) + 1;
        basex = quint32(sourceRect.right() * 65536) + dstx;
    } else {
        int dstx = qCeil((tx1 + qreal(0.5) - targetRect.left()) * sx * 65536) - 1;
        basex = quint32(sourceRect.left() * 65536) + dstx;
    }
    if (sy < 0) {
        int dsty = qFloor((ty1 + qreal(0.5) - targetRect.bottom()) * sy * 65536) + 1;
        srcy = quint32(sourceRect.bottom() * 65536) + dsty;
    } else {
        int dsty = qCeil((ty1 + qreal(0.5) - targetRect.top()) * sy * 65536) - 1;
        srcy = quint32(sourceRect.top() * 65536) + dsty;
    }

    quint32 *dst = ((quint32 *) (destPixels + ty1 * dbpl)) + tx1;

    const __m128i nullVector = _mm_setzero_si128();
    const __m128i half = _mm_set1_epi16(0x80);
    const __m128i one = _mm_set1_epi16(0xff);
    const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i ixVector = _mm_set1_epi32(4*ix);

    // this bounds check here is required as floating point rounding above might in some cases lead to
    // w/h values that are one pixel too large, falling outside of the valid image area.
    const int ystart = srcy >> 16;
    if (ystart >= srch && iy < 0) {
        srcy += iy;
        --h;
    }
    const int xstart = basex >> 16;
    if (xstart >=  (int)(sbpl/sizeof(quint32)) && ix < 0) {
        basex += ix;
        --w;
    }
    int yend = (srcy + iy * (h - 1)) >> 16;
    if (yend < 0 || yend >= srch)
        --h;
    int xend = (basex + ix * (w - 1)) >> 16;
    if (xend < 0 || xend >= (int)(sbpl/sizeof(quint32)))
        --w;

    while (--h >= 0) {
        const uint *src = (const quint32 *) (srcPixels + (srcy >> 16) * sbpl);
        int srcx = basex;
        int x = 0;

        ALIGNMENT_PROLOGUE_16BYTES(dst, x, w) {
            uint s = src[srcx >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
            srcx += ix;
        }

        __m128i srcxVector = _mm_set_epi32(srcx, srcx + ix, srcx + ix + ix, srcx + ix + ix + ix);

        for (; x < (w - 3); x += 4) {
            const int idx0 = _mm_extract_epi16(srcxVector, 1);
            const int idx1 = _mm_extract_epi16(srcxVector, 3);
            const int idx2 = _mm_extract_epi16(srcxVector, 5);
            const int idx3 = _mm_extract_epi16(srcxVector, 7);
            srcxVector = _mm_add_epi32(srcxVector, ixVector);

            const __m128i srcVector = _mm_set_epi32(src[idx0], src[idx1], src[idx2], src[idx3]);
            BLEND_SOURCE_OVER_ARGB32_SSE2_helper(dst, srcVector, nullVector, half, one, colorMask, alphaMask);
        }

        SIMD_EPILOGUE(x, w, 3) {
            uint s = src[(basex + x*ix) >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
        }
        dst = (quint32 *)(((uchar *) dst) + dbpl);
        srcy += iy;
    }
}